

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_srcfiles(CVmImageLoader *this,ulong siz)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  CVmSrcfEntry *this_00;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong read_len;
  ulong uVar7;
  size_t skip_len;
  bool bVar8;
  ulong siz_local;
  char buf [64];
  
  siz_local = siz;
  if (G_srcf_table_X != (CVmSrcfTable *)0x0) {
    CVmSrcfTable::clear(G_srcf_table_X);
    read_data(this,buf,4,&siz_local);
    uVar4 = (ulong)(ushort)buf._0_2_;
    read_len = (ulong)(ushort)buf._2_2_;
    uVar1 = (uint)(ushort)buf._2_2_;
    for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      iVar2 = (*this->fp_->_vptr_CVmImageFile[8])();
      read_data(this,buf,8,&siz_local);
      uVar7 = (ulong)(ushort)buf._6_2_;
      uVar5 = (ulong)(uint)buf._0_4_;
      this_00 = CVmSrcfTable::add_entry(G_srcf_table_X,buf._4_4_ & 0xffff,uVar7);
      read_data(this,this_00->name_buf_,uVar7,&siz_local);
      this_00->name_buf_[uVar7] = '\0';
      read_data(this,buf,4,&siz_local);
      if (uVar1 - 8 < 0x39) {
        uVar7 = (ulong)(uint)buf._0_4_;
        CVmSrcfEntry::alloc_line_records(this_00,uVar7);
        while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
          read_data(this,buf,read_len,&siz_local);
          CVmSrcfEntry::add_line_record(this_00,(ulong)(uint)buf._0_4_,(ulong)(uint)buf._4_4_);
        }
      }
      iVar3 = (*this->fp_->_vptr_CVmImageFile[8])();
      skip_len = (CONCAT44(extraout_var,iVar2) + uVar5) - CONCAT44(extraout_var_00,iVar3);
      if (skip_len != 0) {
        skip_data(this,skip_len,&siz_local);
      }
    }
    return;
  }
  (*this->fp_->_vptr_CVmImageFile[9])();
  return;
}

Assistant:

void CVmImageLoader::load_srcfiles(VMG_ ulong siz)
{
    size_t i;
    char buf[64];
    size_t entry_cnt;
    size_t line_size;

    /* 
     *   if there's no source file table, we're not in debug mode and hence
     *   have no use for this type of information, so skip the block 
     */
    if (G_srcf_table == 0)
    {
        /* skip the entire block in the file */
        fp_->skip_ahead(siz);

        /* we're done */
        return;
    }

    /* clear any existing information in the table */
    G_srcf_table->clear();

    /* read the number of entries in the table, and the line record size */
    read_data(buf, 4, &siz);
    entry_cnt = osrp2(buf);
    line_size = osrp2(buf + 2);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        long start_pos;
        long next_pos;
        int orig_index;
        size_t len;
        CVmSrcfEntry *entry;
        ulong line_cnt;
        ulong skip_amt;

        /* note the starting file location of this record */
        start_pos = fp_->get_seek();

        /* 
         *   read the size of this file record, the original index, and the
         *   length of the filename 
         */
        read_data(buf, 8, &siz);
        orig_index = osrp2(buf + 4);
        len = osrp2(buf + 6);

        /* 
         *   calculate the file location of the start of the next block by
         *   adding the starting position and size of this block 
         */
        next_pos = start_pos + t3rp4u(buf);

        /* allocate the entry */
        entry = G_srcf_table->add_entry(orig_index, len);

        /* read the data into this entry's buffer */
        read_data(entry->get_name_buf(), len, &siz);

        /* null-terminate the buffer */
        entry->get_name_buf()[len] = '\0';

        /* read the number of line records */
        read_data(buf, 4, &siz);
        line_cnt = t3rp4u(buf);

        /* 
         *   if the line records are too big for our buffer, or smaller than
         *   our required minimum size, don't bother reading them - we'll
         *   just skip them entirely 
         */
        if (line_size <= sizeof(buf) && line_size >= 8)
        {
            /* tell the source file table entry how many lines we have */
            entry->alloc_line_records(line_cnt);

            /* read the line records */
            for ( ; line_cnt != 0 ; --line_cnt)
            {
                ulong linenum;
                ulong code_addr;

                /* read the record */
                read_data(buf, line_size, &siz);

                /* get the source line number and byte code offset */
                linenum = t3rp4u(buf);
                code_addr = t3rp4u(buf + 4);

                /* add the line to the source file table entry */
                entry->add_line_record(linenum, code_addr);
            }
        }

        /* skip ahead to the start of the next record */
        skip_amt = next_pos - fp_->get_seek();
        if (skip_amt != 0)
            skip_data(skip_amt, &siz);
    }
}